

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsprintf.c
# Opt level: O0

int vsprintf_s(char *_Dst,size_t _SizeInBytes,char *_Format,__va_list_tag *_ArgList)

{
  int iVar1;
  __va_list_tag *_ArgList_local;
  char *_Format_local;
  size_t _SizeInBytes_local;
  char *_Dst_local;
  
  iVar1 = _vsprintf_s(_Dst,_SizeInBytes,_Format,_ArgList);
  return iVar1;
}

Assistant:

int __cdecl _vsprintf_s (
        char *string,
        size_t sizeInBytes,
        const char *format,
        va_list ap
        )
{
    int retvalue = -1;

    /* validation section */
    _VALIDATE_RETURN(format != NULL, EINVAL, -1);
    _VALIDATE_RETURN(string != NULL && sizeInBytes > 0, EINVAL, -1);

    retvalue = _vsnprintf_helper(_output_s, string, sizeInBytes, format, ap);
    if (retvalue < 0)
    {
        string[0] = 0;
        _SECURECRT__FILL_STRING(string, sizeInBytes, 1);
    }
    if (retvalue == -2)
    {
        _VALIDATE_RETURN(("Buffer too small" && 0), ERANGE, -1);
    }
    if (retvalue >= 0)
    {
        _SECURECRT__FILL_STRING(string, sizeInBytes, retvalue + 1);
    }

    return retvalue;
}